

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_port.hpp
# Opt level: O0

int iutest::internal::posix::FileSeek(FILE *fp,iu_off_t pos,int origin)

{
  int iVar1;
  int origin_local;
  iu_off_t pos_local;
  FILE *fp_local;
  
  iVar1 = fseeko64((FILE *)fp,pos,origin);
  return iVar1;
}

Assistant:

inline int FileSeek(FILE* fp, iu_off_t pos, int origin)
{
#if defined(_MSC_VER)
    return _fseeki64(fp, pos, origin);
#elif defined(_LARGEFILE64_SOURCE)
    return fseeko64(fp, pos, origin);
#elif IUTEST_HAS_LARGEFILE_API
    return fseeko(fp, pos, origin);
#else
    return fseek(fp, pos, origin);
#endif
}